

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundUtxoJsonData,_cfd::js::api::FundUtxoJsonDataStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::FundUtxoJsonData,_cfd::js::api::FundUtxoJsonDataStruct>
                  *this,vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
                        *list)

{
  pointer pFVar1;
  pointer data;
  FundUtxoJsonData object;
  FundUtxoJsonData FStack_108;
  
  pFVar1 = (list->
           super__Vector_base<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pFVar1; data = data + 1) {
    js::api::json::FundUtxoJsonData::FundUtxoJsonData(&FStack_108);
    js::api::json::FundUtxoJsonData::ConvertFromStruct(&FStack_108,data);
    std::
    vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::FundUtxoJsonData>).
                 super_vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
                ,&FStack_108);
    js::api::json::FundUtxoJsonData::~FundUtxoJsonData(&FStack_108);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }